

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O2

bool __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<float>::useAsShaderInput
          (VertexBufferObject<float> *this,Program *program,string *input_attribute_name,
          GLint number_of_components)

{
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  socklen_t __len;
  int line;
  sockaddr *__addr;
  GLuint *__x;
  char *msg;
  GLint location;
  GLuint local_1c;
  
  GVar2 = (program->m_program_status).program_id;
  if (GVar2 != 0) {
    GVar2 = (*this->m_gl->getAttribLocation)(GVar2,(input_attribute_name->_M_dataplus)._M_p);
    local_1c = GVar2;
    GVar3 = (*this->m_gl->getError)();
    glu::checkError(GVar3,"glGetAttribLocation call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                    ,0x194);
    if (-1 < (int)GVar2) {
      (*this->m_gl->enableVertexAttribArray)(GVar2);
      GVar3 = (*this->m_gl->getError)();
      __len = 0x19d;
      glu::checkError(GVar3,"glEnableVertexAttribArray call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                      ,0x19d);
      __x = &local_1c;
      std::vector<int,_std::allocator<int>_>::push_back
                (&this->m_enabled_arrays,(value_type_conflict1 *)__x);
      bind(this,(int)__x,__addr,__len);
      bVar1 = std::type_info::operator==
                        ((type_info *)&float::typeinfo,(type_info *)&float::typeinfo);
      if (bVar1) {
        (*this->m_gl->vertexAttribPointer)(local_1c,number_of_components,0x1406,'\0',0,(void *)0x0);
        GVar3 = (*this->m_gl->getError)();
        msg = "glVertexAttribPointer call failed.";
        line = 0x1a5;
      }
      else {
        bVar1 = std::type_info::operator==
                          ((type_info *)&float::typeinfo,(type_info *)&int::typeinfo);
        if (!bVar1) {
          return false;
        }
        (*this->m_gl->vertexAttribIPointer)(local_1c,number_of_components,0x1406,0,(void *)0x0);
        GVar3 = (*this->m_gl->getError)();
        msg = "glVertexAttribIPointer call failed.";
        line = 0x1aa;
      }
      glu::checkError(GVar3,msg,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cClipDistance.hpp"
                      ,line);
      return true;
    }
  }
  return false;
}

Assistant:

bool gl3cts::ClipDistance::Utility::VertexBufferObject<T>::useAsShaderInput(Program		program,
																			std::string input_attribute_name,
																			glw::GLint  number_of_components)
{
	if (program.ProgramStatus().program_id)
	{
		glw::GLint location = m_gl.getAttribLocation(program.ProgramStatus().program_id, input_attribute_name.c_str());
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGetAttribLocation call failed.");

		if (location >= 0)
		{
			const std::type_info& buffer_type = typeid(T);
			const std::type_info& float_type  = typeid(glw::GLfloat);
			const std::type_info& int_type	= typeid(glw::GLint);

			m_gl.enableVertexAttribArray(location);
			GLU_EXPECT_NO_ERROR(m_gl.getError(), "glEnableVertexAttribArray call failed.");
			m_enabled_arrays.push_back(location);

			bind();

			if (buffer_type == float_type)
			{
				m_gl.vertexAttribPointer(location, number_of_components, GL_FLOAT, false, 0, NULL);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttribPointer call failed.");
			}
			else if (buffer_type == int_type)
			{
				m_gl.vertexAttribIPointer(location, number_of_components, GL_FLOAT, 0, NULL);
				GLU_EXPECT_NO_ERROR(m_gl.getError(), "glVertexAttribIPointer call failed.");
			}
			else
			{
				return false;
			}

			return true;
		}
	}

	return false;
}